

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O0

void __thiscall miniros::Publisher::Impl::~Impl(Impl *this)

{
  undefined8 uVar1;
  string *in_RDI;
  bool enabled;
  undefined8 in_stack_ffffffffffffff98;
  Level LVar2;
  LogLocation *in_stack_ffffffffffffffa0;
  LogLocation *in_stack_ffffffffffffffb0;
  void *logger_handle;
  Impl *in_stack_ffffffffffffffc0;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  _Alloc_hider in_stack_ffffffffffffffd7;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  LVar2 = (Level)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (((console::g_initialized ^ 0xff) & 1) != 0) {
    console::initialize();
  }
  if (((~Impl::loc.initialized_ ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffc0 = (Impl *)&stack0xffffffffffffffd7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffffd7,
                        CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
    console::initializeLogLocation
              ((LogLocation *)
               CONCAT17(in_stack_ffffffffffffffd7,
                        CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)),in_RDI,
               (Level)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  }
  if (~Impl::loc.level_ != Debug) {
    console::setLogLocationLevel(in_stack_ffffffffffffffa0,LVar2);
    console::checkLogLocationEnabled(in_stack_ffffffffffffffb0);
  }
  LVar2 = ~Impl::loc.level_;
  if ((~Impl::loc.logger_enabled_ & 1U) != 0) {
    logger_handle = ~Impl::loc.logger_;
    uVar1 = std::__cxx11::string::c_str();
    console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/publisher.cpp"
                   ,0x28,"miniros::Publisher::Impl::~Impl()",
                   "Publisher on \'%s\' deregistering callbacks.",uVar1);
  }
  unadvertise(in_stack_ffffffffffffffc0);
  std::shared_ptr<miniros::SubscriberCallbacks>::~shared_ptr
            ((shared_ptr<miniros::SubscriberCallbacks> *)0x4923ce);
  std::shared_ptr<miniros::NodeHandle>::~shared_ptr((shared_ptr<miniros::NodeHandle> *)0x4923dc);
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  std::__cxx11::string::~string((string *)in_RDI);
  return;
}

Assistant:

Publisher::Impl::~Impl()
{
  MINIROS_DEBUG("Publisher on '%s' deregistering callbacks.", topic_.c_str());
  unadvertise();
}